

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_linux.cc
# Opt level: O2

void __thiscall
rcdiscover::SocketLinux::SocketLinux
          (SocketLinux *this,int domain,int type,int protocol,in_addr_t dst_ip,uint16_t port,
          string iface_name)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  OperationNotPermitted *this_00;
  SocketException *pSVar3;
  int *piVar4;
  allocator<char> local_79;
  in_addr_t local_78;
  int yes;
  string local_70;
  char *local_50;
  size_type local_48;
  char local_40;
  undefined7 uStack_3f;
  undefined8 uStack_38;
  
  local_78 = dst_ip;
  std::__cxx11::string::string((string *)&local_50,(string *)iface_name._M_dataplus._M_p);
  paVar1 = &(this->super_Socket<rcdiscover::SocketLinux>).iface_name_.field_2;
  (this->super_Socket<rcdiscover::SocketLinux>).iface_name_._M_dataplus._M_p = (pointer)paVar1;
  if (local_50 == &local_40) {
    paVar1->_M_allocated_capacity = CONCAT71(uStack_3f,local_40);
    *(undefined8 *)((long)&(this->super_Socket<rcdiscover::SocketLinux>).iface_name_.field_2 + 8) =
         uStack_38;
  }
  else {
    (this->super_Socket<rcdiscover::SocketLinux>).iface_name_._M_dataplus._M_p = local_50;
    (this->super_Socket<rcdiscover::SocketLinux>).iface_name_.field_2._M_allocated_capacity =
         CONCAT71(uStack_3f,local_40);
  }
  (this->super_Socket<rcdiscover::SocketLinux>).iface_name_._M_string_length = local_48;
  local_48 = 0;
  local_40 = '\0';
  local_50 = &local_40;
  std::__cxx11::string::~string((string *)&local_50);
  this->sock_ = -1;
  (this->dst_addr_).sin_family = 0;
  (this->dst_addr_).sin_port = 0;
  (this->dst_addr_).sin_addr = 0;
  (this->dst_addr_).sin_zero[0] = '\0';
  (this->dst_addr_).sin_zero[1] = '\0';
  (this->dst_addr_).sin_zero[2] = '\0';
  (this->dst_addr_).sin_zero[3] = '\0';
  (this->dst_addr_).sin_zero[4] = '\0';
  (this->dst_addr_).sin_zero[5] = '\0';
  (this->dst_addr_).sin_zero[6] = '\0';
  (this->dst_addr_).sin_zero[7] = '\0';
  iVar2 = socket(domain,type,protocol);
  this->sock_ = iVar2;
  if (iVar2 != -1) {
    (this->dst_addr_).sin_addr.s_addr = local_78;
    (this->dst_addr_).sin_family = 2;
    (this->dst_addr_).sin_port = port << 8 | port >> 8;
    yes = 1;
    iVar2 = setsockopt(iVar2,1,0xf,&yes,4);
    if (iVar2 != -1) {
      return;
    }
    pSVar3 = (SocketException *)__cxa_allocate_exception(0x38);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,"Error while setting socket options",&local_79);
    piVar4 = __errno_location();
    SocketException::SocketException(pSVar3,&local_70,*piVar4);
    __cxa_throw(pSVar3,&SocketException::typeinfo,SocketException::~SocketException);
  }
  piVar4 = __errno_location();
  if (*piVar4 == 1) {
    this_00 = (OperationNotPermitted *)__cxa_allocate_exception(0x10);
    OperationNotPermitted::OperationNotPermitted(this_00);
    __cxa_throw(this_00,&OperationNotPermitted::typeinfo,std::runtime_error::~runtime_error);
  }
  pSVar3 = (SocketException *)__cxa_allocate_exception(0x38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"Error while creating socket",(allocator<char> *)&yes);
  SocketException::SocketException(pSVar3,&local_70,*piVar4);
  __cxa_throw(pSVar3,&SocketException::typeinfo,SocketException::~SocketException);
}

Assistant:

SocketLinux::SocketLinux(int domain, int type, int protocol,
                         in_addr_t dst_ip, uint16_t port,
                         std::string iface_name) :
  Socket(std::move(iface_name)),
  sock_(-1),
  dst_addr_()
{
  sock_ = ::socket(domain, type, protocol);
  if (sock_ == -1)
  {
    if (errno == EPERM)
    {
      throw OperationNotPermitted();
    }

    throw SocketException("Error while creating socket", errno);
  }

  dst_addr_.sin_addr.s_addr = dst_ip;
  dst_addr_.sin_family = AF_INET;
  dst_addr_.sin_port = htons(port);

  const int yes = 1;
  if (::setsockopt(sock_,
                  SOL_SOCKET,
                  SO_REUSEPORT,
                  reinterpret_cast<const char *>(&yes),
                  sizeof(yes)) == -1)
  {
    throw SocketException("Error while setting socket options", errno);
  }
}